

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall pbrt::syntactic::MappedFile::~MappedFile(MappedFile *this)

{
  FileMapping *in_RDI;
  
  FileMapping::~FileMapping(in_RDI);
  std::__cxx11::string::~string((string *)in_RDI);
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE MappedFile {
      typedef std::shared_ptr<MappedFile> SP;

      MappedFile(const std::string &fn)
        : name_(fn)
        , file_(fn)
        , data_(reinterpret_cast<const char*>(file_.data()), file_.nbytes())
        , pos_(data_.cbegin())
      {
      }

      /* check if current position is end of file */
      bool eof() const {
        return pos_ == data_.cend();
      }

      /*! get character according to current file position */
      int get() {
        if (eof())
          return EOF;
        else
          return static_cast<int>(static_cast<unsigned char>(*pos_++));
      }

      /*! get name of the file */
      std::string getFileName() const {
        return name_;
      }

    private:
      std::string name_;

      FileMapping file_;

      StringView data_;
      const char* pos_;
    }